

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leb128.cc
# Opt level: O2

Offset wabt::WriteFixedU32Leb128Raw(uint8_t *data,uint8_t *end,uint32_t value)

{
  if ((long)end - (long)data < 5) {
    return 0;
  }
  *data = (byte)value | 0x80;
  data[1] = (byte)(value >> 7) | 0x80;
  data[2] = (byte)(value >> 0xe) | 0x80;
  data[3] = (byte)(value >> 0x15) | 0x80;
  data[4] = (byte)(value >> 0x1c);
  return 5;
}

Assistant:

Offset WriteFixedU32Leb128Raw(uint8_t* data, uint8_t* end, uint32_t value) {
  if (end - data < MAX_U32_LEB128_BYTES) {
    return 0;
  }
  data[0] = (value & 0x7f) | 0x80;
  data[1] = ((value >> 7) & 0x7f) | 0x80;
  data[2] = ((value >> 14) & 0x7f) | 0x80;
  data[3] = ((value >> 21) & 0x7f) | 0x80;
  data[4] = ((value >> 28) & 0x0f);
  return MAX_U32_LEB128_BYTES;
}